

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O1

TRexBool trex_match(TRex *exp,char *text)

{
  size_t sVar1;
  char *pcVar2;
  TRexBool TVar3;
  
  exp->_bol = text;
  sVar1 = strlen(text);
  exp->_eol = text + sVar1;
  exp->_currsubexp = 0;
  TVar3 = 0;
  pcVar2 = trex_matchnode(exp,exp->_nodes,text,(TRexNode *)0x0);
  if (pcVar2 != (char *)0x0) {
    TVar3 = (TRexBool)(pcVar2 == exp->_eol);
  }
  return TVar3;
}

Assistant:

TRexBool trex_match(TRex * exp, const TRexChar * text) {
	const TRexChar * res = NULL;
	exp->_bol = text;
	exp->_eol = text + scstrlen(text);
	exp->_currsubexp = 0;
	res = trex_matchnode(exp, exp->_nodes, text, NULL);

	if (res == NULL || res != exp->_eol) {
		return TRex_False;
	}

	return TRex_True;
}